

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpanel_dfs.c
# Opt level: O2

void zpanel_dfs(int m,int w,int jcol,SuperMatrix *A,int *perm_r,int *nseg,doublecomplex *dense,
               int *panel_lsub,int *segrep,int *repfnz,int_t *xprune,int *marker,int *parent,
               int_t *xplore,GlobalLU_t *Glu)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  int *piVar10;
  int_t *piVar11;
  int_t *piVar12;
  double dVar13;
  int iVar14;
  long lVar15;
  int_t *piVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  doublecomplex *local_88;
  
  pvVar4 = A->Store;
  lVar5 = *(long *)((long)pvVar4 + 8);
  lVar6 = *(long *)((long)pvVar4 + 0x10);
  lVar7 = *(long *)((long)pvVar4 + 0x18);
  lVar8 = *(long *)((long)pvVar4 + 0x20);
  *nseg = 0;
  piVar9 = Glu->xsup;
  piVar10 = Glu->supno;
  piVar11 = Glu->lsub;
  piVar12 = Glu->xlsub;
  local_88 = dense;
  lVar24 = (long)jcol;
  do {
    if (w + jcol <= lVar24) {
      return;
    }
    iVar23 = (int)lVar24;
    iVar19 = (iVar23 - jcol) * m;
    for (lVar21 = (long)*(int *)(lVar7 + lVar24 * 4); lVar21 < *(int *)(lVar8 + lVar24 * 4);
        lVar21 = lVar21 + 1) {
      iVar20 = *(int *)(lVar6 + lVar21 * 4);
      pdVar1 = (double *)(lVar5 + lVar21 * 0x10);
      dVar13 = pdVar1[1];
      local_88[iVar20].r = *pdVar1;
      local_88[iVar20].i = dVar13;
      if (marker[iVar20] != iVar23) {
        marker[iVar20] = iVar23;
        iVar22 = perm_r[iVar20];
        if ((long)iVar22 == -1) {
          lVar17 = (long)iVar19;
          iVar19 = iVar19 + 1;
          panel_lsub[lVar17] = iVar20;
        }
        else {
          lVar17 = (long)piVar9[(long)piVar10[iVar22] + 1];
          if (repfnz[lVar17 + -1] == -1) {
            parent[lVar17 + -1] = -1;
            lVar15 = lVar17 + -1;
            repfnz[lVar17 + -1] = iVar22;
            piVar16 = piVar12;
LAB_001042b5:
            iVar20 = xprune[lVar15];
            iVar22 = piVar16[lVar15];
LAB_001042c4:
            lVar17 = (long)iVar22;
            do {
              iVar14 = (int)lVar15;
              iVar22 = (int)lVar17;
              if (iVar20 <= iVar22) {
                if (marker[(long)m + (long)iVar14] < jcol) {
                  segrep[*nseg] = iVar14;
                  *nseg = *nseg + 1;
                  marker[(long)m + (long)iVar14] = iVar23;
                }
                lVar15 = (long)parent[iVar14];
                piVar16 = xplore;
                if (lVar15 == -1) goto LAB_001043a8;
                goto LAB_001042b5;
              }
              iVar2 = piVar11[lVar17];
              if (marker[iVar2] != iVar23) {
                marker[iVar2] = iVar23;
                iVar3 = perm_r[iVar2];
                if ((long)iVar3 == -1) {
                  lVar17 = (long)iVar19;
                  iVar19 = iVar19 + 1;
                  panel_lsub[lVar17] = iVar2;
                  iVar22 = iVar22 + 1;
                  goto LAB_001042c4;
                }
                lVar18 = (long)piVar9[(long)piVar10[iVar3] + 1];
                if (repfnz[lVar18 + -1] == -1) goto LAB_00104323;
                if (iVar3 < repfnz[lVar18 + -1]) {
                  repfnz[lVar18 + -1] = iVar3;
                }
              }
              lVar17 = lVar17 + 1;
            } while( true );
          }
          if (iVar22 < repfnz[lVar17 + -1]) {
            repfnz[lVar17 + -1] = iVar22;
          }
        }
      }
LAB_001043a8:
    }
    repfnz = repfnz + m;
    local_88 = local_88 + m;
    lVar24 = lVar24 + 1;
  } while( true );
LAB_00104323:
  lVar15 = lVar18 + -1;
  xplore[iVar14] = iVar22 + 1;
  parent[lVar18 + -1] = iVar14;
  repfnz[lVar18 + -1] = iVar3;
  iVar22 = piVar12[lVar18 + -1];
  iVar20 = xprune[lVar18 + -1];
  goto LAB_001042c4;
}

Assistant:

void
zpanel_dfs (
	   const int  m,           /* in - number of rows in the matrix */
	   const int  w,           /* in */
	   const int  jcol,        /* in */
	   SuperMatrix *A,       /* in - original matrix */
	   int        *perm_r,     /* in */
	   int        *nseg,	   /* out */
	   doublecomplex     *dense,      /* out */
	   int        *panel_lsub, /* out */
	   int        *segrep,     /* out */
	   int        *repfnz,     /* out */
	   int_t      *xprune,     /* out */
	   int        *marker,     /* out */     
	   int        *parent,     /* working array */
	   int_t      *xplore,     /* working array */
	   GlobalLU_t *Glu         /* modified */
	   )
{

    NCPformat *Astore;
    doublecomplex    *a;
    int_t     *asub;
    int_t     *xa_begin, *xa_end, k;
    int       krow, kmark, kperm;
    int	      krep, chperm, chmark, chrep, oldrep, kchild, myfnz, kpar;
    int       jj;	   /* index through each column in the panel */
    int       *marker1;	   /* marker1[jj] >= jcol if vertex jj was visited 
			      by a previous column within this panel.   */
    int       *repfnz_col; /* start of each column in the panel */
    doublecomplex    *dense_col;  /* start of each column in the panel */
    int_t     nextl_col;   /* next available position in panel_lsub[*,jj] */
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    int_t      xdfs, maxdfs;

    /* Initialize pointers */
    Astore     = A->Store;
    a          = Astore->nzval;
    asub       = Astore->rowind;
    xa_begin   = Astore->colbeg;
    xa_end     = Astore->colend;
    marker1    = marker + m;
    repfnz_col = repfnz;
    dense_col  = dense;
    *nseg      = 0;
    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;

    /* For each column in the panel */
    for (jj = jcol; jj < jcol + w; jj++) {
	nextl_col = (jj - jcol) * m;

#ifdef CHK_DFS
	printf("\npanel col %d: ", jj);
#endif

	/* For each nonz in A[*,jj] do dfs */
	for (k = xa_begin[jj]; k < xa_end[jj]; k++) {
	    krow = asub[k];
            dense_col[krow] = a[k];
	    kmark = marker[krow];    	
	    if ( kmark == jj ) 
		continue;     /* krow visited before, go to the next nonzero */

	    /* For each unmarked nbr krow of jj
	     * krow is in L: place it in structure of L[*,jj]
	     */
	    marker[krow] = jj;
	    kperm = perm_r[krow];
	    
	    if ( kperm == SLU_EMPTY ) {
		panel_lsub[nextl_col++] = krow; /* krow is indexed into A */
	    }
	    /* 
	     * krow is in U: if its supernode-rep krep
	     * has been explored, update repfnz[*]
	     */
	    else {
		
		krep = xsup[supno[kperm]+1] - 1;
		myfnz = repfnz_col[krep];
		
#ifdef CHK_DFS
		printf("krep %d, myfnz %d, perm_r[%d] %d\n", krep, myfnz, krow, kperm);
#endif
		if ( myfnz != SLU_EMPTY ) {	/* Representative visited before */
		    if ( myfnz > kperm ) repfnz_col[krep] = kperm;
		    /* continue; */
		}
		else {
		    /* Otherwise, perform dfs starting at krep */
		    oldrep = SLU_EMPTY;
		    parent[krep] = oldrep;
		    repfnz_col[krep] = kperm;
		    xdfs = xlsub[krep];
		    maxdfs = xprune[krep];
		    
#ifdef CHK_DFS 
		    printf("  xdfs %d, maxdfs %d: ", xdfs, maxdfs);
		    for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
		    printf("\n");
#endif
		    do {
			/* 
			 * For each unmarked kchild of krep 
			 */
			while ( xdfs < maxdfs ) {
			    
			    kchild = lsub[xdfs];
			    xdfs++;
			    chmark = marker[kchild];
			    
			    if ( chmark != jj ) { /* Not reached yet */
				marker[kchild] = jj;
				chperm = perm_r[kchild];
			      
				/* Case kchild is in L: place it in L[*,j] */
				if ( chperm == SLU_EMPTY ) {
				    panel_lsub[nextl_col++] = kchild;
				} 
				/* Case kchild is in U: 
				 *   chrep = its supernode-rep. If its rep has 
				 *   been explored, update its repfnz[*]
				 */
				else {
				    
				    chrep = xsup[supno[chperm]+1] - 1;
				    myfnz = repfnz_col[chrep];
#ifdef CHK_DFS
				    printf("chrep %d,myfnz %d,perm_r[%d] %d\n",chrep,myfnz,kchild,chperm);
#endif
				    if ( myfnz != SLU_EMPTY ) { /* Visited before */
					if ( myfnz > chperm )
					    repfnz_col[chrep] = chperm;
				    }
				    else {
					/* Cont. dfs at snode-rep of kchild */
					xplore[krep] = xdfs;	
					oldrep = krep;
					krep = chrep; /* Go deeper down G(L) */
					parent[krep] = oldrep;
					repfnz_col[krep] = chperm;
					xdfs = xlsub[krep];     
					maxdfs = xprune[krep];
#ifdef CHK_DFS 
					printf("  xdfs %d, maxdfs %d: ", xdfs, maxdfs);
					for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);	
					printf("\n");
#endif
				    } /* else */
				  
				} /* else */
			      
			    } /* if... */
			    
			} /* while xdfs < maxdfs */
			
			/* krow has no more unexplored nbrs:
			 *    Place snode-rep krep in postorder DFS, if this 
			 *    segment is seen for the first time. (Note that
			 *    "repfnz[krep]" may change later.)
			 *    Backtrack dfs to its parent.
			 */
			if ( marker1[krep] < jcol ) {
			    segrep[*nseg] = krep;
			    ++(*nseg);
			    marker1[krep] = jj;
			}
			
			kpar = parent[krep]; /* Pop stack, mimic recursion */
			if ( kpar == SLU_EMPTY ) break; /* dfs done */
			krep = kpar;
			xdfs = xplore[krep];
			maxdfs = xprune[krep];
			
#ifdef CHK_DFS 
			printf("  pop stack: krep %d,xdfs %d,maxdfs %d: ", krep,xdfs,maxdfs);
			for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
			printf("\n");
#endif
		    } while ( kpar != SLU_EMPTY ); /* do-while - until empty stack */
		    
		} /* else */
		
	    } /* else */
	    
	} /* for each nonz in A[*,jj] */
	
	repfnz_col += m;    /* Move to next column */
        dense_col += m;
	
    } /* for jj ... */
    
}